

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

bool __thiscall
tinygltf::AnimationSampler::operator==(AnimationSampler *this,AnimationSampler *other)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  
  bVar1 = Equals(&this->extras,&other->extras);
  if ((((bVar1) &&
       ((this->extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        (other->extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count)) &&
      (bVar1 = std::__equal<false>::
               equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Value>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Value>>>
                         ((this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                          (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>
                           )&(this->extensions)._M_t._M_impl.super__Rb_tree_header,
                          (other->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left),
      bVar1)) &&
     (((this->input == other->input &&
       (__n = (this->interpolation)._M_string_length, __n == (other->interpolation)._M_string_length
       )) && ((__n == 0 ||
              (iVar2 = bcmp((this->interpolation)._M_dataplus._M_p,
                            (other->interpolation)._M_dataplus._M_p,__n), iVar2 == 0)))))) {
    return this->output == other->output;
  }
  return false;
}

Assistant:

bool AnimationSampler::operator==(const AnimationSampler &other) const {
  return this->extras == other.extras && this->extensions == other.extensions &&
         this->input == other.input &&
         this->interpolation == other.interpolation &&
         this->output == other.output;
}